

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2ffcdf::ArgParser::argEncUserPassword(ArgParser *this,string *arg)

{
  allocator<char> local_39;
  string local_38;
  
  if ((this->accumulated_args).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->accumulated_args).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"positional and dashed encryption arguments may not be mixed",
               &local_39);
    QPDFArgParser::usage(&this->ap,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  this->used_enc_password_args = true;
  std::__cxx11::string::_M_assign((string *)&this->user_password);
  return;
}

Assistant:

void
ArgParser::argEncUserPassword(std::string const& arg)
{
    if (!accumulated_args.empty()) {
        usage("positional and dashed encryption arguments may not be mixed");
    }
    this->used_enc_password_args = true;
    this->user_password = arg;
}